

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O0

AggregateFunction *
duckdb::UDFWrapper::
CreateUnaryAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::dtime_t>
          (string *name,LogicalType *ret_type,LogicalType *input_type)

{
  LogicalType *in_RDX;
  string *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *aggr_function;
  FunctionNullHandling in_stack_0000009f;
  LogicalType *in_stack_000000a0;
  LogicalType *in_stack_000000a8;
  AggregateFunction *pAVar1;
  LogicalType local_40 [31];
  undefined1 local_21;
  string *local_10;
  
  local_21 = 0;
  pAVar1 = in_RDI;
  local_10 = in_RSI;
  duckdb::LogicalType::LogicalType(local_40,in_RDX);
  AggregateFunction::
  UnaryAggregate<duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::dtime_t,duckdb::UDFAverageFunction,(duckdb::AggregateDestructorType)0>
            (in_stack_000000a8,in_stack_000000a0,in_stack_0000009f);
  duckdb::LogicalType::~LogicalType(local_40);
  std::__cxx11::string::operator=((string *)&in_RDI->field_0x8,local_10);
  return pAVar1;
}

Assistant:

inline static AggregateFunction CreateUnaryAggregateFunction(const string &name, const LogicalType &ret_type,
	                                                             const LogicalType &input_type) {
		AggregateFunction aggr_function =
		    AggregateFunction::UnaryAggregate<STATE, TR, TA, UDF_OP>(input_type, ret_type);
		aggr_function.name = name;
		return aggr_function;
	}